

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

wchar_t node__try(EditLine *el,keymacro_node_t *ptr,wchar_t *str,keymacro_value_t *val,wchar_t ntype
                 )

{
  wchar_t wVar1;
  keymacro_node_t *pkVar2;
  wchar_t *pwVar3;
  keymacro_node_t *local_40;
  keymacro_node_t *xm;
  wchar_t ntype_local;
  keymacro_value_t *val_local;
  wchar_t *str_local;
  keymacro_node_t *ptr_local;
  EditLine *el_local;
  
  local_40 = ptr;
  str_local = &ptr->ch;
  if (ptr->ch != *str) {
    while ((local_40->sibling != (keymacro_node_t *)0x0 && (local_40->sibling->ch != *str))) {
      local_40 = local_40->sibling;
    }
    if (local_40->sibling == (keymacro_node_t *)0x0) {
      pkVar2 = node__get(*str);
      local_40->sibling = pkVar2;
    }
    str_local = &local_40->sibling->ch;
  }
  if (str[1] == L'\0') {
    if (*(long *)(str_local + 4) != 0) {
      node__put(el,*(keymacro_node_t **)(str_local + 4));
      str_local[4] = L'\0';
      str_local[5] = L'\0';
    }
    wVar1 = str_local[1];
    if (wVar1 != L'\0') {
      if (wVar1 == L'\x01') {
        if (*(long *)(str_local + 2) != 0) {
          free(*(void **)(str_local + 2));
        }
      }
      else if (wVar1 != L'\x02') {
        abort();
      }
    }
    str_local[1] = ntype;
    if (ntype == L'\0') {
      *(keymacro_value_t *)(str_local + 2) = *val;
    }
    else {
      if (ntype != L'\x01') {
        abort();
      }
      pwVar3 = wcsdup(val->str);
      *(wchar_t **)(str_local + 2) = pwVar3;
      if (pwVar3 == (wchar_t *)0x0) {
        return L'\xffffffff';
      }
    }
  }
  else {
    if (*(long *)(str_local + 4) == 0) {
      pkVar2 = node__get(str[1]);
      *(keymacro_node_t **)(str_local + 4) = pkVar2;
    }
    node__try(el,*(keymacro_node_t **)(str_local + 4),str + 1,val,ntype);
  }
  return L'\0';
}

Assistant:

static int
node__try(EditLine *el, keymacro_node_t *ptr, const wchar_t *str,
    keymacro_value_t *val, int ntype)
{

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			xm->sibling = node__get(*str);	/* setup new node */
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (ptr->next != NULL) {
			node__put(el, ptr->next);
				/* lose longer keys with this prefix */
			ptr->next = NULL;
		}
		switch (ptr->type) {
		case XK_CMD:
		case XK_NOD:
			break;
		case XK_STR:
			if (ptr->val.str)
				el_free(ptr->val.str);
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n",
			    ptr->type));
			break;
		}

		switch (ptr->type = ntype) {
		case XK_CMD:
			ptr->val = *val;
			break;
		case XK_STR:
			if ((ptr->val.str = wcsdup(val->str)) == NULL)
				return -1;
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
			break;
		}
	} else {
		/* still more chars to go */
		if (ptr->next == NULL)
			ptr->next = node__get(*str);	/* setup new node */
		(void) node__try(el, ptr->next, str, val, ntype);
	}
	return 0;
}